

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

string * __thiscall
upb::generator::GetModeInit_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,upb_MiniTableField *field32,
          upb_MiniTableField *field64)

{
  AlphaNum local_178;
  string local_148;
  AlphaNum local_128;
  AlphaNum local_f8;
  AlphaNum local_c8;
  AlphaNum local_98;
  AlphaNum local_68;
  byte local_22;
  undefined1 local_21;
  uint8_t mode32;
  upb_MiniTableField *puStack_20;
  upb_MiniTableField *field64_local;
  upb_MiniTableField *field32_local;
  string *ret;
  
  local_21 = 0;
  puStack_20 = field32;
  field64_local = (upb_MiniTableField *)this;
  field32_local = (upb_MiniTableField *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_22 = field64_local->mode_dont_copy_me__upb_internal_use_only;
  if ((local_22 & 3) == 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"(int)kUpb_FieldMode_Map");
  }
  else if ((local_22 & 3) == 1) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"(int)kUpb_FieldMode_Array");
  }
  else if ((local_22 & 3) == 2) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,"(int)kUpb_FieldMode_Scalar");
  }
  if ((local_22 & 4) != 0) {
    absl::lts_20240722::AlphaNum::AlphaNum(&local_68," | (int)kUpb_LabelFlags_IsPacked");
    absl::lts_20240722::StrAppend((string *)__return_storage_ptr__,&local_68);
  }
  if ((local_22 & 8) != 0) {
    absl::lts_20240722::AlphaNum::AlphaNum(&local_98," | (int)kUpb_LabelFlags_IsExtension");
    absl::lts_20240722::StrAppend((string *)__return_storage_ptr__,&local_98);
  }
  if ((local_22 & 0x10) != 0) {
    absl::lts_20240722::AlphaNum::AlphaNum(&local_c8," | (int)kUpb_LabelFlags_IsAlternate");
    absl::lts_20240722::StrAppend((string *)__return_storage_ptr__,&local_c8);
  }
  absl::lts_20240722::AlphaNum::AlphaNum(&local_f8," | ((int)");
  GetFieldRep_abi_cxx11_(&local_148,(generator *)field64_local,puStack_20,field64);
  absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_128,&local_148);
  absl::lts_20240722::AlphaNum::AlphaNum(&local_178," << kUpb_FieldRep_Shift)");
  absl::lts_20240722::StrAppend((string *)__return_storage_ptr__,&local_f8,&local_128,&local_178);
  std::__cxx11::string::~string((string *)&local_148);
  return __return_storage_ptr__;
}

Assistant:

std::string GetModeInit(const upb_MiniTableField* field32,
                        const upb_MiniTableField* field64) {
  std::string ret;
  uint8_t mode32 = field32->UPB_PRIVATE(mode);
  switch (mode32 & kUpb_FieldMode_Mask) {
    case kUpb_FieldMode_Map:
      ret = "(int)kUpb_FieldMode_Map";
      break;
    case kUpb_FieldMode_Array:
      ret = "(int)kUpb_FieldMode_Array";
      break;
    case kUpb_FieldMode_Scalar:
      ret = "(int)kUpb_FieldMode_Scalar";
      break;
    default:
      break;
  }

  if (mode32 & kUpb_LabelFlags_IsPacked) {
    absl::StrAppend(&ret, " | (int)kUpb_LabelFlags_IsPacked");
  }

  if (mode32 & kUpb_LabelFlags_IsExtension) {
    absl::StrAppend(&ret, " | (int)kUpb_LabelFlags_IsExtension");
  }

  if (mode32 & kUpb_LabelFlags_IsAlternate) {
    absl::StrAppend(&ret, " | (int)kUpb_LabelFlags_IsAlternate");
  }

  absl::StrAppend(&ret, " | ((int)", GetFieldRep(field32, field64),
                  " << kUpb_FieldRep_Shift)");
  return ret;
}